

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

void __thiscall djb::npf::npf(npf *this,char *uber_texture,char *name)

{
  int iVar1;
  FILE *__stream;
  exc *peVar2;
  reference __ptr;
  size_type __n;
  int local_38;
  int i;
  FILE *pf;
  char *name_local;
  char *uber_texture_local;
  npf *this_local;
  
  brdf_rgb::brdf_rgb(&this->super_brdf_rgb);
  (this->super_brdf_rgb).super_brdf._vptr_brdf = (_func_int **)&PTR_eval_00280580;
  (this->m_uber_texture).super__Vector_base<djb::vec3,_std::allocator<djb::vec3>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_uber_texture).super__Vector_base<djb::vec3,_std::allocator<djb::vec3>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_uber_texture).super__Vector_base<djb::vec3,_std::allocator<djb::vec3>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<djb::vec3,_std::allocator<djb::vec3>_>::vector(&this->m_uber_texture);
  this->m_id = -1;
  this->m_first = true;
  __stream = fopen(uber_texture,"rb");
  if (__stream == (FILE *)0x0) {
    peVar2 = (exc *)__cxa_allocate_exception(0x28);
    exc::exc(peVar2,"djb_error: Failed to load %s\n",uber_texture);
    __cxa_throw(peVar2,&exc::typeinfo,exc::~exc);
  }
  std::vector<djb::vec3,_std::allocator<djb::vec3>_>::resize(&this->m_uber_texture,0x20000);
  __ptr = std::vector<djb::vec3,_std::allocator<djb::vec3>_>::operator[](&this->m_uber_texture,0);
  __n = std::vector<djb::vec3,_std::allocator<djb::vec3>_>::size(&this->m_uber_texture);
  fread(__ptr,0xc,__n,__stream);
  fclose(__stream);
  local_38 = 0;
  do {
    if (99 < local_38) {
LAB_0016fd07:
      if (this->m_id == -1) {
        peVar2 = (exc *)__cxa_allocate_exception(0x28);
        exc::exc(peVar2,"djb_error: No NPF parameters for %s\n",name);
        __cxa_throw(peVar2,&exc::typeinfo,exc::~exc);
      }
      return;
    }
    iVar1 = strcmp(*(char **)(s_list + (long)local_38 * 8),name);
    if (iVar1 == 0) {
      this->m_id = local_38;
      fprintf(_stdout,"djb_verbose: MERL ID: %i\n",(ulong)(uint)this->m_id);
      goto LAB_0016fd07;
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

npf::npf(const char *uber_texture, const char *name):
    m_uber_texture(), m_id(-1), m_first(true)
{
	// load the uber_texture
	FILE *pf = fopen(uber_texture, "rb");
	if (!pf)
		throw exc("djb_error: Failed to load %s\n", uber_texture);

	m_uber_texture.resize(512*256);
	fread(&m_uber_texture[0], sizeof(m_uber_texture[0]), m_uber_texture.size(), pf);
	fclose(pf);

	// extract id from name
	for (int i = 0; i < 100; ++i) {
		if (!strcmp(s_list[i], name)) {
			m_id = i;
#ifndef NVERBOSE
			DJB_LOG("djb_verbose: MERL ID: %i\n", m_id);
#endif
			break;
		}
	}
	if (m_id == -1) throw exc("djb_error: No NPF parameters for %s\n", name);
}